

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.h
# Opt level: O2

FunctionValue * NULLC::construct<FunctionValue>(int count)

{
  FunctionValue *pFVar1;
  ulong uVar2;
  
  pFVar1 = (FunctionValue *)(*(code *)alloc)(count * 0x18 | 4);
  if (count != 0) {
    uVar2 = (long)count * 0x18 - 0x18;
    pFVar1 = (FunctionValue *)memset(pFVar1,0,(uVar2 - uVar2 % 0x18) + 0x18);
    return pFVar1;
  }
  return pFVar1;
}

Assistant:

static T*		construct(int count)
	{
		void *tmp = (void*)alloc(4 + count * sizeof(T));
		new(tmp) T[count];
		return (T*)tmp;
	}